

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::CmpHelperOpFailure<void*,Struct2*>
          (internal *this,char *expr1,char *expr2,void **val1,Struct2 **val2,char *op)

{
  AssertionResult *pAVar1;
  Struct2 **ppSVar2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar3;
  Struct2 **val2_local;
  void **val1_local;
  AssertionResult local_78;
  char *local_68;
  char *op_local;
  char *expr2_local;
  char *expr1_local;
  string local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  ppSVar2 = (Struct2 **)val1;
  local_68 = op;
  op_local = expr2;
  expr2_local = expr1;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_78,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&expr2_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_68);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x1e844d);
  pAVar1 = AssertionResult::operator<<(pAVar1,&op_local);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  FormatForComparisonFailureMessage<void*,Struct2*>(&local_30,(internal *)val1,val2,ppSVar2);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_30);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  FormatForComparisonFailureMessage<Struct2*,void*>
            ((string *)&expr1_local,(internal *)val2,(Struct2 **)val1,ppSVar2);
  pAVar1 = AssertionResult::operator<<
                     (pAVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &expr1_local);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  std::__cxx11::string::~string((string *)&expr1_local);
  std::__cxx11::string::~string((string *)&local_30);
  AssertionResult::~AssertionResult(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    AVar3.message_.ptr_ = extraout_RDX.ptr_;
    AVar3._0_8_ = this;
    return AVar3;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}